

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool __thiscall
testing::internal::OnCallSpec<MockProblemBuilder::AlgebraicCon_&(int)>::Matches
          (OnCallSpec<MockProblemBuilder::AlgebraicCon_&(int)> *this,ArgumentTuple *args)

{
  bool bVar1;
  tuple<testing::Matcher<int>_> *in_RDI;
  tuple<int> *in_stack_00000008;
  MatcherBase<const_std::tuple<int>_&> *in_stack_00000010;
  tuple<int> *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<int>>,std::tuple<int>>
                    (in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    local_11 = MatcherBase<const_std::tuple<int>_&>::Matches(in_stack_00000010,in_stack_00000008);
  }
  return local_11;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }